

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_color_hsva_f(float *out_h,float *out_s,float *out_v,float *out_a,nk_color in)

{
  float *in_RCX;
  float *in_RDX;
  float *in_RSI;
  float *in_RDI;
  nk_color in_R8D;
  nk_colorf col;
  nk_colorf local_38;
  float *local_28;
  float *local_20;
  float *local_18;
  float *local_10;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  nk_color_f(&local_38.r,&local_38.g,&local_38.b,&local_38.a,in_R8D);
  nk_colorf_hsva_f(local_10,local_18,local_20,local_28,local_38);
  return;
}

Assistant:

NK_API void
nk_color_hsva_f(float *out_h, float *out_s,
float *out_v, float *out_a, struct nk_color in)
{
struct nk_colorf col;
nk_color_f(&col.r,&col.g,&col.b,&col.a, in);
nk_colorf_hsva_f(out_h, out_s, out_v, out_a, col);
}